

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

vector<User,_std::allocator<User>_> * __thiscall
Database::getAllUsers(vector<User,_std::allocator<User>_> *__return_storage_ptr__,Database *this)

{
  sqlite3 *db;
  int iVar1;
  char *pcVar2;
  DatabaseException *this_00;
  string local_a8 [39];
  allocator local_81;
  string local_80 [8];
  string error;
  int retval;
  allocator local_49;
  string local_48 [8];
  string query;
  char *local_20;
  char *errorMsg;
  Database *this_local;
  vector<User,_std::allocator<User>_> *result;
  
  local_20 = (char *)0x0;
  errorMsg = (char *)this;
  this_local = (Database *)__return_storage_ptr__;
  std::vector<User,_std::allocator<User>_>::vector(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"select * from users;",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  db = this->database;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = sqlite3_exec(db,pcVar2,add_user_callback,__return_storage_ptr__,&local_20);
  pcVar2 = local_20;
  if (iVar1 == 0) {
    std::__cxx11::string::~string(local_48);
    return __return_storage_ptr__;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,pcVar2,&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  sqlite3_free(local_20);
  this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::operator+((char *)local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Error while getting all users: ");
  DatabaseException::DatabaseException(this_00,local_a8);
  __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

std::vector<User> Database::getAllUsers()
{
	char* errorMsg = nullptr;
	std::vector<User> result;
	std::string query = "select * from users;";

	int retval = sqlite3_exec(database, query.c_str(), add_user_callback, &result, &errorMsg);

	if(retval != SQLITE_OK)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while getting all users: " + error);
	}
	else
	{
		return result;
	}
}